

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkTargetIDList.cpp
# Opt level: O0

void __thiscall LinkTargetIDList::printLinkTargetIdList(LinkTargetIDList *this)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  int local_38;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  LinkTargetIDList *local_10;
  LinkTargetIDList *this_local;
  
  local_10 = this;
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "____________________LinkTargetIdList______________________");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"IDListSize:                         ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_28,&this->IDListSize);
  iVar1 = Utils::lenTwoBytes(&local_28);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," bytes");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_28);
  poVar2 = std::operator<<((ostream *)&std::cout,"IDList:                             ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_38 = 0;
  while( true ) {
    uVar3 = (ulong)local_38;
    sVar4 = std::vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
            ::size(&this->IDList);
    if (sVar4 <= uVar3) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"   ItemID ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38 + 1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"       ItemIDSize:                  ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
    pvVar5 = std::
             vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>::
             operator[](&this->IDList,(long)local_38);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,&pvVar5->ItemIDSize);
    iVar1 = Utils::lenTwoBytes(&local_50);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2," bytes");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_50);
    std::operator<<((ostream *)&std::cout,"       Data:                        ");
    pvVar5 = std::
             vector<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>::
             operator[](&this->IDList,(long)local_38);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_68,&pvVar5->Data);
    Utils::parseItemData(&local_68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_68);
    local_38 = local_38 + 1;
  }
  std::operator<<((ostream *)&std::cout,"   TerminalID:                      ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,&this->TerminalID);
  Utils::print_vec(&local_80);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_80);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void LinkTargetIDList::printLinkTargetIdList() {
    cout <<"____________________LinkTargetIdList______________________" << endl;
    cout << "IDListSize:                         " << dec << Utils::lenTwoBytes(IDListSize) << " bytes" << endl;
    cout << "IDList:                             " << endl ;
    for(int i = 0; i < IDList.size(); ++i){
        cout << "   ItemID " << dec << i + 1 << endl;
        cout << "       ItemIDSize:                  " << dec << Utils::lenTwoBytes(IDList[i].ItemIDSize) << " bytes" << endl;
        cout << "       Data:                        "; Utils::parseItemData(IDList[i].Data);
    }
    cout << "   TerminalID:                      "; Utils::print_vec(TerminalID);
    cout << "_________________________________________________________" << endl;
}